

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O1

bool Js::EquivalentTypeSet::AreIdentical(EquivalentTypeSet *left,EquivalentTypeSet *right)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  ulong uVar6;
  
  if (left->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(left);
  }
  if (right->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(right);
  }
  if ((left->sortedAndDuplicatesRemoved != true) || (right->sortedAndDuplicatesRemoved == false)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                ,0x41,
                                "(left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved())"
                                ,
                                "left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (left->count == right->count) {
    bVar2 = left->count == 0;
    if ((!bVar2) &&
       (bVar3 = JITTypeHolderBase<Memory::Recycler>::operator!=
                          ((left->types).ptr,(right->types).ptr), !bVar3)) {
      uVar6 = 0;
      lVar5 = 8;
      do {
        uVar6 = uVar6 + 1;
        bVar2 = left->count <= uVar6;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = JITTypeHolderBase<Memory::Recycler>::operator!=
                          ((JITTypeHolderBase<Memory::Recycler> *)
                           ((long)&(((left->types).ptr)->t).ptr + lVar5),
                           (JITTypeHolderBase<Memory::Recycler> *)
                           ((long)&(((right->types).ptr)->t).ptr + lVar5));
        lVar5 = lVar5 + 8;
      } while (!bVar3);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool EquivalentTypeSet::AreIdentical(EquivalentTypeSet * left, EquivalentTypeSet * right)
{
    if (!left->GetSortedAndDuplicatesRemoved())
    {
        left->SortAndRemoveDuplicates();
    }
    if (!right->GetSortedAndDuplicatesRemoved())
    {
        right->SortAndRemoveDuplicates();
    }

    Assert(left->GetSortedAndDuplicatesRemoved() && right->GetSortedAndDuplicatesRemoved());

    if (left->count != right->count)
    {
        return false;
    }

    // TODO: OOP JIT, optimize this (previously we had memcmp)
    for (uint i = 0; i < left->count; ++i)
    {
        if (left->types[i] != right->types[i])
        {
            return false;
        }
    }
    return true;
}